

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void block_free(block_s *blk)

{
  uint16_t *puVar1;
  block_s *__s;
  block_s *__addr;
  long *plVar2;
  long lVar3;
  fio_lock_i fVar4;
  long lVar5;
  long *plVar6;
  fio_lock_i ret;
  timespec local_28;
  
  LOCK();
  puVar1 = &blk->ref;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    __s = blk + 1;
    memset(__s,0,0x7ff0);
    LOCK();
    UNLOCK();
    while (memory.lock != '\0') {
      memory.lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
    }
    memory.lock = '\x01';
    blk[1].parent = (block_s *)memory.available.prev;
    *(anon_struct_32_4_90625080 **)&blk[1].ref = &memory;
    *(block_s **)&((block_s *)memory.available.prev)->ref = __s;
    __addr = blk->parent;
    LOCK();
    puVar1 = &__addr->root_ref;
    memory.available.prev = (fio_ls_embd_s *)__s;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (*puVar1 == 0) {
      lVar5 = 0;
      do {
        plVar6 = (long *)((long)&__addr[1].parent + lVar5);
        plVar2 = *(long **)((long)&__addr[1].ref + lVar5);
        if (plVar2 != plVar6 && plVar2 != (long *)0x0) {
          lVar3 = *(long *)((long)&__addr[1].parent + lVar5);
          *plVar2 = lVar3;
          *(long **)(lVar3 + 8) = plVar2;
          *(long **)((long)&__addr[1].ref + lVar5) = plVar6;
          *(long *)((long)&__addr[1].parent + lVar5) = (long)&__addr[1].parent + lVar5;
        }
        fVar4 = memory.lock;
        lVar5 = lVar5 + 0x8000;
      } while (lVar5 != 0x800000);
      LOCK();
      memory.lock = '\0';
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar4);
      munmap(__addr,0x800000);
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7146): memory allocator returned %p to the system"
                       ,__addr);
      }
    }
    else {
      LOCK();
      memory.lock = '\0';
      UNLOCK();
    }
  }
  return;
}

Assistant:

static inline void block_free(block_s *blk) {
  if (fio_atomic_sub(&blk->ref, 1))
    return;

  memset(blk + 1, 0, (FIO_MEMORY_BLOCK_SIZE - sizeof(*blk)));
  fio_lock(&memory.lock);
  fio_ls_embd_push(&memory.available, &((block_node_s *)blk)->node);

  blk = blk->parent;

  if (fio_atomic_sub(&blk->root_ref, 1)) {
    fio_unlock(&memory.lock);
    return;
  }
  // fio_unlock(&memory.lock);
  // return;

  /* remove all of the root block's children (slices) from the memory pool */
  for (size_t i = 0; i < FIO_MEMORY_BLOCKS_PER_ALLOCATION; ++i) {
    block_node_s *pos =
        (block_node_s *)((uintptr_t)blk + (i * FIO_MEMORY_BLOCK_SIZE));
    fio_ls_embd_remove(&pos->node);
  }

  fio_unlock(&memory.lock);
  sys_free(blk, FIO_MEMORY_BLOCK_SIZE * FIO_MEMORY_BLOCKS_PER_ALLOCATION);
  FIO_LOG_DEBUG("memory allocator returned %p to the system", (void *)blk);
  FIO_MEMORY_ON_BLOCK_FREE();
}